

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_tri_seg_intersection
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_INT *face_nodes,REF_DBL *t,REF_DBL *uvw
          )

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  REF_DBL RVar10;
  REF_DBL node1_volume;
  REF_DBL node0_volume;
  undefined8 local_48;
  REF_INT local_40;
  REF_INT local_3c;
  REF_DBL node2_volume;
  
  local_48 = *(undefined8 *)face_nodes;
  local_40 = face_nodes[2];
  local_3c = node0;
  uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_48,&node0_volume);
  if (uVar2 == 0) {
    local_3c = node1;
    uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_48,&node1_volume);
    if (uVar2 == 0) {
      auVar6._0_8_ = (node0_volume - node1_volume) * 1e+20;
      auVar6._8_8_ = node0_volume;
      auVar8._0_8_ = -auVar6._0_8_;
      auVar8._8_8_ = -node0_volume;
      auVar6 = maxpd(auVar6,auVar8);
      if (auVar6._0_8_ <= auVar6._8_8_) {
        return 4;
      }
      *t = node0_volume / (node0_volume - node1_volume);
      local_40 = node0;
      local_3c = node1;
      uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_48,&node2_volume);
      if (uVar2 == 0) {
        local_48 = *(undefined8 *)(face_nodes + 1);
        uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_48,&node0_volume);
        if (uVar2 == 0) {
          local_48 = CONCAT44(*face_nodes,face_nodes[2]);
          uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_48,&node1_volume);
          if (uVar2 == 0) {
            dVar5 = node0_volume + node1_volume + node2_volume;
            auVar9._0_8_ = dVar5 * 1e+20;
            auVar9._8_8_ = node0_volume;
            auVar1._8_8_ = -node0_volume;
            auVar1._0_8_ = -auVar9._0_8_;
            auVar6 = maxpd(auVar9,auVar1);
            dVar7 = auVar6._0_8_;
            if (dVar7 <= auVar6._8_8_) {
              return 4;
            }
            *uvw = node0_volume / dVar5;
            RVar10 = node1_volume;
            if (node1_volume <= -node1_volume) {
              RVar10 = -node1_volume;
            }
            if (dVar7 <= RVar10) {
              return 4;
            }
            uvw[1] = node1_volume / dVar5;
            RVar10 = node2_volume;
            if (node2_volume <= -node2_volume) {
              RVar10 = -node2_volume;
            }
            if (dVar7 <= RVar10) {
              return 4;
            }
            uvw[2] = node2_volume / dVar5;
            return 0;
          }
          pcVar4 = "face 1 vol";
          uVar3 = 0xa29;
        }
        else {
          pcVar4 = "face 20 vol";
          uVar3 = 0xa26;
        }
      }
      else {
        pcVar4 = "face 2 vol";
        uVar3 = 0xa23;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar3,
             "ref_node_tri_seg_intersection",(ulong)uVar2,pcVar4);
      return uVar2;
    }
    pcVar4 = "node 1 vol";
    uVar3 = 0xa1c;
  }
  else {
    pcVar4 = "node 0 vol";
    uVar3 = 0xa1a;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar3,
         "ref_node_tri_seg_intersection",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_seg_intersection(REF_NODE ref_node,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_INT *face_nodes,
                                                 REF_DBL *t, REF_DBL *uvw) {
  REF_DBL node0_volume, node1_volume, node2_volume, total_volume;
  REF_INT nodes[4];
  nodes[0] = face_nodes[0];
  nodes[1] = face_nodes[1];
  nodes[2] = face_nodes[2];
  nodes[3] = node0;
  RSS(ref_node_tet_vol(ref_node, nodes, &node0_volume), "node 0 vol");
  nodes[3] = node1;
  RSS(ref_node_tet_vol(ref_node, nodes, &node1_volume), "node 1 vol");
  total_volume = node0_volume - node1_volume;
  if (!ref_math_divisible(node0_volume, total_volume)) return REF_DIV_ZERO;
  *t = node0_volume / total_volume;

  nodes[2] = node0;
  nodes[3] = node1;
  RSS(ref_node_tet_vol(ref_node, nodes, &node2_volume), "face 2 vol");
  nodes[0] = face_nodes[1];
  nodes[1] = face_nodes[2];
  RSS(ref_node_tet_vol(ref_node, nodes, &node0_volume), "face 20 vol");
  nodes[0] = face_nodes[2];
  nodes[1] = face_nodes[0];
  RSS(ref_node_tet_vol(ref_node, nodes, &node1_volume), "face 1 vol");
  total_volume = node0_volume + node1_volume + node2_volume;

  if (!ref_math_divisible(node0_volume, total_volume)) return REF_DIV_ZERO;
  uvw[0] = node0_volume / total_volume;
  if (!ref_math_divisible(node1_volume, total_volume)) return REF_DIV_ZERO;
  uvw[1] = node1_volume / total_volume;
  if (!ref_math_divisible(node2_volume, total_volume)) return REF_DIV_ZERO;
  uvw[2] = node2_volume / total_volume;
  return REF_SUCCESS;
}